

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationSpeed.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMotorRotationSpeed::ConstraintsBiLoad_Ct(ChLinkMotorRotationSpeed *this,double factor)

{
  undefined1 auVar1 [16];
  ChConstraintTwoBodies *pCVar2;
  char cVar3;
  long lVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  cVar3 = (**(code **)(*(long *)&(this->super_ChLinkMotorRotation).super_ChLinkMotor.
                                 super_ChLinkMateGeneric.super_ChLinkMate.super_ChLink.
                                 super_ChLinkBase.super_ChPhysicsItem + 0x48))();
  if (cVar3 != '\0') {
    dVar5 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
            super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime;
    (*((this->super_ChLinkMotorRotation).super_ChLinkMotor.m_func.
       super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_ChFunction
      [4])();
    lVar4 = (long)(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.
                  nconstr;
    if (lVar4 < 1) {
      __assert_fail("(i >= 0) && (i < nconstr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMask.h"
                    ,0x37,"ChConstraintTwoBodies &chrono::ChLinkMask::Constr_N(int)");
    }
    pCVar2 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.
             constraints.
             super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar4 + -1];
    if ((pCVar2->super_ChConstraintTwo).super_ChConstraint.active == true) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = factor;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (pCVar2->super_ChConstraintTwo).super_ChConstraint.b_i;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = dVar5 * -0.5;
      auVar1 = vfmadd213sd_fma(auVar6,auVar7,auVar1);
      (pCVar2->super_ChConstraintTwo).super_ChConstraint.b_i = auVar1._0_8_;
    }
  }
  return;
}

Assistant:

void ChLinkMotorRotationSpeed::ConstraintsBiLoad_Ct(double factor) {
    if (!this->IsActive())
        return;

    double mCt = -0.5 * m_func->Get_y(this->GetChTime());
    int ncrz = mask.nconstr - 1;
    if (mask.Constr_N(ncrz).IsActive()) {
        mask.Constr_N(ncrz).Set_b_i(mask.Constr_N(ncrz).Get_b_i() + factor * mCt);
    }
}